

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O0

void __thiscall HTTPRequestTracker::RemoveRequest(HTTPRequestTracker *this,evhttp_request *req)

{
  long lVar1;
  bool bVar2;
  evhttp_request **ppeVar3;
  pointer ppVar4;
  unsigned_long uVar5;
  char *in_RDI;
  long in_FS_OFFSET;
  iterator it;
  evhttp_connection *conn;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock10;
  Mutex *in_stack_ffffffffffffff68;
  unordered_map<const_evhttp_connection_*,_unsigned_long,_std::hash<const_evhttp_connection_*>,_std::equal_to<const_evhttp_connection_*>,_std::allocator<std::pair<const_evhttp_connection_*const,_unsigned_long>_>_>
  *in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff78;
  undefined4 uVar6;
  char *it_00;
  char *in_stack_ffffffffffffff98;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffffa0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  it_00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp";
  uVar6 = 0xb7;
  ppeVar3 = inline_assertion_check<true,evhttp_request*&>
                      ((evhttp_request **)in_stack_ffffffffffffffa8,
                       (char *)in_stack_ffffffffffffffa0,
                       (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),in_RDI,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp"
                      );
  evhttp_request_get_connection(*ppeVar3);
  inline_assertion_check<true,evhttp_connection*>
            ((evhttp_connection **)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
             (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),in_RDI,it_00);
  MaybeCheckNotHeld(in_stack_ffffffffffffff68);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_RDI,
             (int)((ulong)it_00 >> 0x20),SUB81((ulong)it_00 >> 0x18,0));
  std::
  unordered_map<const_evhttp_connection_*,_unsigned_long,_std::hash<const_evhttp_connection_*>,_std::equal_to<const_evhttp_connection_*>,_std::allocator<std::pair<const_evhttp_connection_*const,_unsigned_long>_>_>
  ::find(in_stack_ffffffffffffff70,(key_type *)in_stack_ffffffffffffff68);
  std::
  unordered_map<const_evhttp_connection_*,_unsigned_long,_std::hash<const_evhttp_connection_*>,_std::equal_to<const_evhttp_connection_*>,_std::allocator<std::pair<const_evhttp_connection_*const,_unsigned_long>_>_>
  ::end(in_stack_ffffffffffffff70);
  bVar2 = std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_evhttp_connection_*const,_unsigned_long>,_false>
                      *)CONCAT44(uVar6,in_stack_ffffffffffffff78),
                     (_Node_iterator_base<std::pair<const_evhttp_connection_*const,_unsigned_long>,_false>
                      *)in_stack_ffffffffffffff70);
  in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 & 0xffffff;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_evhttp_connection_*const,_unsigned_long>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_evhttp_connection_*const,_unsigned_long>,_false,_false>
                           *)in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff78 = CONCAT13(ppVar4->second != 0,(int3)in_stack_ffffffffffffff78);
  }
  if ((char)(in_stack_ffffffffffffff78 >> 0x18) != '\0') {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_evhttp_connection_*const,_unsigned_long>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_evhttp_connection_*const,_unsigned_long>,_false,_false>
                           *)in_stack_ffffffffffffff68);
    uVar5 = ppVar4->second - 1;
    ppVar4->second = uVar5;
    if (uVar5 == 0) {
      RemoveConnectionInternal
                ((HTTPRequestTracker *)CONCAT44(uVar6,in_stack_ffffffffffffff78),(iterator)it_00);
    }
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        const evhttp_connection* conn{Assert(evhttp_request_get_connection(Assert(req)))};
        LOCK(m_mutex);
        auto it{m_tracker.find(conn)};
        if (it != m_tracker.end() && it->second > 0) {
            if (--(it->second) == 0) RemoveConnectionInternal(it);
        }
    }